

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  FormData *pFVar1;
  CURLcode CVar2;
  size_t sVar3;
  size_t sVar4;
  FormData *pFVar5;
  FormData *data;
  Form temp;
  curl_off_t size;
  char buffer [8192];
  FormData *local_2068;
  Form local_2060;
  curl_off_t local_2040;
  char local_2038 [8200];
  
  CVar2 = Curl_getformdata((SessionHandle *)0x0,&local_2068,form,(char *)0x0,&local_2040);
  if (CVar2 == CURLE_OK) {
    if (local_2068 != (FormData *)0x0) {
      pFVar5 = local_2068;
      do {
        if ((pFVar5->type & ~FORM_CONTENT) == FORM_CALLBACK) {
          local_2060.sent = 0;
          local_2060.fp = (FILE *)0x0;
          local_2060.fread_func = (curl_read_callback)0x0;
          local_2060.data = pFVar5;
          do {
            sVar3 = readfromfile(&local_2060,local_2038,0x2000);
            if ((0x2000 < sVar3) || (sVar4 = (*append)(arg,local_2038,sVar3), sVar3 != sVar4)) {
              if ((FILE *)local_2060.fp != (FILE *)0x0) {
                fclose((FILE *)local_2060.fp);
              }
              while (local_2068 != (FormData *)0x0) {
                pFVar5 = local_2068->next;
                if (local_2068->type < FORM_CALLBACK) {
                  (*Curl_cfree)(local_2068->line);
                }
                (*Curl_cfree)(local_2068);
                local_2068 = pFVar5;
              }
              return -1;
            }
          } while (sVar3 != 0);
        }
        else {
          sVar3 = pFVar5->length;
          sVar4 = (*append)(arg,pFVar5->line,sVar3);
          if (sVar3 != sVar4) {
            while (local_2068 != (FormData *)0x0) {
              pFVar5 = local_2068->next;
              if (local_2068->type < FORM_CALLBACK) {
                (*Curl_cfree)(local_2068->line);
              }
              (*Curl_cfree)(local_2068);
              local_2068 = pFVar5;
            }
            return -1;
          }
        }
        pFVar5 = pFVar5->next;
      } while (pFVar5 != (FormData *)0x0);
    }
    CVar2 = CURLE_OK;
    pFVar5 = local_2068;
    while (pFVar5 != (FormData *)0x0) {
      pFVar1 = pFVar5->next;
      if (pFVar5->type < FORM_CALLBACK) {
        (*Curl_cfree)(pFVar5->line);
      }
      (*Curl_cfree)(pFVar5);
      pFVar5 = pFVar1;
    }
  }
  return CVar2;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_off_t size;
  struct FormData *data, *ptr;

  result = Curl_getformdata(NULL, &data, form, NULL, &size);
  if(result)
    return (int)result;

  for(ptr = data; ptr; ptr = ptr->next) {
    if((ptr->type == FORM_FILE) || (ptr->type == FORM_CALLBACK)) {
      char buffer[8192];
      size_t nread;
      struct Form temp;

      Curl_FormInit(&temp, ptr);

      do {
        nread = readfromfile(&temp, buffer, sizeof(buffer));
        if((nread == (size_t) -1) ||
           (nread > sizeof(buffer)) ||
           (nread != append(arg, buffer, nread))) {
          if(temp.fp)
            fclose(temp.fp);
          Curl_formclean(&data);
          return -1;
        }
      } while(nread);
    }
    else {
      if(ptr->length != append(arg, ptr->line, ptr->length)) {
        Curl_formclean(&data);
        return -1;
      }
    }
  }
  Curl_formclean(&data);
  return 0;
}